

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_scanAtts(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  uint uVar9;
  char **ppcVar11;
  byte *pbVar12;
  byte *pbVar13;
  byte *extraout_RDX;
  byte *extraout_RDX_00;
  byte *extraout_RDX_01;
  byte *extraout_RDX_02;
  byte *extraout_RDX_03;
  byte *extraout_RDX_04;
  byte *extraout_RDX_05;
  byte *extraout_RDX_06;
  byte *extraout_RDX_07;
  byte *extraout_RDX_08;
  ulong uVar14;
  byte *pbVar15;
  int unaff_EBP;
  byte *local_50;
  char *local_48;
  char **local_40;
  char *local_38;
  uint uVar10;
  
  lVar7 = (long)end - (long)ptr;
  if (0 < lVar7) {
    pcVar8 = end + -1;
    local_38 = end + -2;
    pbVar13 = (byte *)end;
    local_50 = (byte *)ptr;
    local_40 = nextTokPtr;
    do {
      pbVar15 = local_50;
      uVar10 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*local_50);
      uVar9 = uVar10 - 5;
      if (0x18 < uVar9) {
switchD_004095fc_caseD_8:
        *nextTokPtr = (char *)local_50;
        return 0;
      }
      ppcVar11 = (char **)((long)&switchD_004095fc::switchdataD_0057b59c +
                          (long)(int)(&switchD_004095fc::switchdataD_0057b59c)[uVar9]);
      switch(uVar10) {
      case 5:
        if (lVar7 == 1) {
          return -2;
        }
        iVar5 = (*enc[3].scanners[0])(enc,(char *)local_50,(char *)pbVar13,ppcVar11);
        if (iVar5 == 0) {
LAB_00409b73:
          *local_40 = (char *)pbVar15;
          return 0;
        }
        local_50 = pbVar15 + 2;
        pbVar13 = extraout_RDX_05;
        nextTokPtr = local_40;
        break;
      case 6:
        if (lVar7 < 3) {
          return -2;
        }
        iVar5 = (*enc[3].scanners[1])(enc,(char *)local_50,(char *)pbVar13,ppcVar11);
        if (iVar5 == 0) goto LAB_00409b73;
        local_50 = pbVar15 + 3;
        pbVar13 = extraout_RDX_04;
        nextTokPtr = local_40;
        break;
      case 7:
        if (lVar7 < 4) {
          return -2;
        }
        iVar5 = (*enc[3].scanners[2])(enc,(char *)local_50,(char *)pbVar13,ppcVar11);
        if (iVar5 == 0) goto LAB_00409b73;
        local_50 = pbVar15 + 4;
        pbVar13 = extraout_RDX_03;
        nextTokPtr = local_40;
        break;
      default:
        goto switchD_004095fc_caseD_8;
      case 9:
      case 10:
      case 0x15:
        lVar7 = (long)pcVar8 - (long)local_50;
        do {
          local_50 = local_50 + 1;
          iVar5 = 1;
          if (lVar7 < 1) {
            unaff_EBP = -1;
          }
          else {
            bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*local_50);
            if (bVar2 - 9 < 2) {
LAB_00409641:
              iVar5 = 0;
            }
            else if (bVar2 == 0xe) {
              iVar5 = 5;
            }
            else {
              if (bVar2 == 0x15) goto LAB_00409641;
              *nextTokPtr = (char *)local_50;
              unaff_EBP = 0;
            }
          }
          lVar7 = lVar7 + -1;
        } while (iVar5 == 0);
        if (iVar5 == 1) {
          return unaff_EBP;
        }
      case 0xe:
        pbVar15 = local_50 + 1;
        pbVar13 = local_50;
        if ((byte *)end == pbVar15 || (long)end - (long)pbVar15 < 0) {
LAB_0040993e:
          bVar3 = true;
          unaff_EBP = -1;
        }
        else {
          bVar2 = *(byte *)((long)enc[1].scanners + (ulong)local_50[1]);
          uVar14 = CONCAT71((int7)((ulong)pcVar8 >> 8),bVar2);
          local_48 = pcVar8;
          if ((bVar2 & 0xfe) != 0xc) {
            lVar7 = (long)local_38 - (long)local_50;
            do {
              local_50 = pbVar15;
              if ((0x15 < (byte)uVar14) ||
                 (pbVar13 = (byte *)(uVar14 & 0xff), (0x200600U >> ((uint)pbVar13 & 0x1f) & 1) == 0)
                 ) {
                *nextTokPtr = (char *)local_50;
                bVar3 = true;
                pbVar15 = local_50;
                unaff_EBP = 0;
                goto LAB_00409a01;
              }
              pbVar15 = (byte *)end;
              if (lVar7 < 1) goto LAB_0040993e;
              uVar14 = CONCAT71((int7)(uVar14 >> 8),
                                *(undefined1 *)((long)enc[1].scanners + (ulong)local_50[1]));
              pbVar13 = (byte *)(uVar14 & 0xfffffffe);
              lVar7 = lVar7 + -1;
              pbVar15 = local_50 + 1;
            } while ((char)pbVar13 != '\f');
          }
          pbVar13 = local_50 + 2;
          local_50 = pbVar13;
          iVar5 = unaff_EBP;
          do {
            pbVar15 = local_50;
            lVar7 = (long)end - (long)local_50;
            iVar6 = 1;
            bVar3 = true;
            if (lVar7 < 1) {
              iVar5 = -1;
LAB_00409756:
              bVar3 = true;
              goto LAB_00409759;
            }
            bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*local_50);
            pbVar13 = (byte *)(ulong)bVar2;
            if (bVar2 == (byte)uVar14) {
              iVar6 = 0xb;
              bVar3 = false;
              goto LAB_00409759;
            }
            uVar9 = (uint)bVar2;
            if (8 < uVar9) {
switchD_0040974f_caseD_4:
              local_50 = local_50 + 1;
              bVar3 = false;
              iVar6 = 0;
              goto LAB_00409759;
            }
            pbVar13 = (byte *)((long)&switchD_0040974f::switchdataD_0057b600 +
                              (long)(int)(&switchD_0040974f::switchdataD_0057b600)[uVar9]);
            switch(uVar9) {
            default:
              *nextTokPtr = (char *)local_50;
              iVar5 = 0;
              goto LAB_00409756;
            case 3:
              iVar4 = normal_scanRef(enc,(char *)(local_50 + 1),end,(char **)&local_50);
              bVar3 = false;
              iVar6 = 0;
              pbVar13 = extraout_RDX_01;
              nextTokPtr = local_40;
              if (iVar4 < 1) {
                if (iVar4 == 0) {
                  *local_40 = (char *)local_50;
                }
                bVar3 = true;
                iVar6 = 1;
                iVar5 = iVar4;
              }
              break;
            case 4:
              goto switchD_0040974f_caseD_4;
            case 5:
              if (lVar7 == 1) {
LAB_004097ac:
                iVar5 = -2;
              }
              else {
                iVar6 = (*enc[3].nameLength)(enc,(char *)local_50);
                pbVar13 = extraout_RDX;
                if (iVar6 == 0) {
                  local_50 = pbVar15 + 2;
                  goto LAB_00409835;
                }
LAB_0040981a:
                *local_40 = (char *)pbVar15;
                bVar3 = true;
                iVar6 = 1;
                nextTokPtr = local_40;
                iVar5 = 0;
              }
              break;
            case 6:
              if (lVar7 < 3) goto LAB_004097ac;
              pcVar8 = (*enc[3].skipS)(enc,(char *)local_50);
              pbVar13 = extraout_RDX_00;
              if ((int)pcVar8 != 0) goto LAB_0040981a;
              local_50 = pbVar15 + 3;
              goto LAB_00409835;
            case 7:
              if (lVar7 < 4) goto LAB_004097ac;
              iVar6 = (*enc[3].getAtts)(enc,(char *)local_50,(int)pbVar13,(ATTRIBUTE *)0x1);
              pbVar13 = extraout_RDX_02;
              if (iVar6 != 0) goto LAB_0040981a;
              local_50 = pbVar15 + 4;
LAB_00409835:
              bVar3 = false;
              iVar6 = 0;
              nextTokPtr = local_40;
            }
LAB_00409759:
          } while (iVar6 == 0);
          pcVar8 = local_48;
          pbVar15 = local_50;
          unaff_EBP = iVar5;
          if (iVar6 == 0xb) {
            pbVar12 = local_50 + 1;
            pbVar13 = (byte *)(end + -(long)pbVar12);
            unaff_EBP = -1;
            bVar3 = true;
            pbVar15 = pbVar12;
            if (0 < (long)pbVar13) {
              bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar12);
              pbVar13 = (byte *)(ulong)bVar2;
              if (bVar2 < 0x11) {
                if (bVar2 - 9 < 2) {
LAB_0040995e:
                  pbVar13 = (byte *)(end + -(long)(local_50 + 2));
                  pbVar15 = local_50 + 2;
                  if (0 < (long)pbVar13) {
                    pbVar13 = (byte *)(end + -(long)pbVar12);
                    lVar7 = 1;
                    ppcVar11 = (char **)0x0;
LAB_0040997f:
                    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)pbVar12[lVar7])) {
                    case 5:
                      pbVar15 = pbVar12 + (1 - (long)ppcVar11);
                      if (pbVar13 + (long)ppcVar11 == (byte *)0x2) {
                        pbVar13 = (byte *)0x2;
                        unaff_EBP = -2;
                        goto LAB_00409a01;
                      }
                      local_50 = pbVar15;
                      iVar6 = (*enc[3].literalScanners[0])
                                        (enc,(char *)pbVar15,(char *)(pbVar13 + (long)ppcVar11),
                                         ppcVar11);
                      pbVar13 = extraout_RDX_08;
                      if (iVar6 == 0) goto LAB_00409b36;
                      pbVar15 = pbVar12 + (3 - (long)ppcVar11);
                      break;
                    case 6:
                      pbVar15 = pbVar12 + (1 - (long)ppcVar11);
                      unaff_EBP = -2;
                      if ((byte *)((long)ppcVar11 + (long)pbVar13) + -1 < (char **)0x3)
                      goto LAB_00409a01;
                      local_50 = pbVar15;
                      iVar6 = (*enc[3].literalScanners[1])
                                        (enc,(char *)pbVar15,(char *)pbVar13,
                                         (char **)((byte *)((long)ppcVar11 + (long)pbVar13) + -1));
                      pbVar13 = extraout_RDX_07;
                      if (iVar6 == 0) {
LAB_00409b36:
                        *local_40 = (char *)pbVar15;
                        nextTokPtr = local_40;
                        goto LAB_00409b3e;
                      }
                      pbVar15 = pbVar12 + (4 - (long)ppcVar11);
                      break;
                    case 7:
                      pbVar15 = pbVar12 + (1 - (long)ppcVar11);
                      unaff_EBP = -2;
                      if ((byte *)((long)ppcVar11 + (long)pbVar13) + -1 < &DAT_00000004)
                      goto LAB_00409a01;
                      local_50 = pbVar15;
                      iVar6 = (*enc[3].nameMatchesAscii)
                                        (enc,(char *)pbVar15,(char *)pbVar13,
                                         (char *)((byte *)((long)ppcVar11 + (long)pbVar13) + -1));
                      pbVar13 = extraout_RDX_06;
                      if (iVar6 == 0) goto LAB_00409b36;
                      pbVar15 = pbVar12 + (5 - (long)ppcVar11);
                      break;
                    default:
                      local_50 = pbVar12 + (1 - (long)ppcVar11);
                      *nextTokPtr = (char *)local_50;
LAB_00409b3e:
                      pcVar8 = local_48;
                      pbVar15 = local_50;
                      unaff_EBP = 0;
                      goto LAB_00409a01;
                    case 9:
                    case 10:
                    case 0x15:
                      goto switchD_004099a2_caseD_9;
                    case 0xb:
                      local_50 = pbVar12 + (1 - (long)ppcVar11);
                      goto LAB_004098a5;
                    case 0x11:
                      pbVar12 = pbVar12 + (1 - (long)ppcVar11);
                      goto LAB_00409a3c;
                    case 0x16:
                    case 0x18:
                      bVar3 = false;
                      pbVar15 = pbVar12 + (2 - (long)ppcVar11);
                      unaff_EBP = iVar5;
                      goto LAB_00409a01;
                    }
                    bVar3 = false;
                    pcVar8 = local_48;
                    nextTokPtr = local_40;
                    unaff_EBP = iVar5;
                  }
                }
                else {
                  local_50 = pbVar12;
                  if (bVar2 == 0xb) {
LAB_004098a5:
                    *nextTokPtr = (char *)(local_50 + 1);
                    pbVar15 = local_50;
                    unaff_EBP = 1;
                  }
                  else {
LAB_004099d0:
                    *nextTokPtr = (char *)pbVar12;
                    local_50 = pbVar12;
LAB_00409a6b:
                    pbVar15 = local_50;
                    unaff_EBP = 0;
                  }
                }
              }
              else {
                if (bVar2 != 0x11) {
                  if (bVar2 != 0x15) goto LAB_004099d0;
                  goto LAB_0040995e;
                }
LAB_00409a3c:
                local_50 = pbVar12;
                pbVar13 = local_50 + 1;
                pbVar15 = pbVar13;
                if ((byte *)end != pbVar13 && -1 < (long)end - (long)pbVar13) {
                  if (*pbVar13 != 0x3e) {
                    *nextTokPtr = (char *)pbVar13;
                    local_50 = pbVar13;
                    goto LAB_00409a6b;
                  }
                  *nextTokPtr = (char *)(local_50 + 2);
                  unaff_EBP = 3;
                }
              }
            }
          }
        }
LAB_00409a01:
        local_50 = pbVar15;
        if (bVar3) {
          return unaff_EBP;
        }
        break;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        local_50 = local_50 + 1;
      }
      lVar7 = (long)end - (long)local_50;
    } while (0 < lVar7);
  }
  return -1;
switchD_004099a2_caseD_9:
  pbVar1 = pbVar13 + (long)ppcVar11;
  ppcVar11 = (char **)((long)ppcVar11 + -1);
  lVar7 = lVar7 + 1;
  pbVar15 = (byte *)end;
  if (pbVar1 == (byte *)0x2 || (long)(pbVar1 + -2) < 0) goto LAB_00409a01;
  goto LAB_0040997f;
}

Assistant:

static int PTRCALL
PREFIX(scanAtts)(const ENCODING *enc, const char *ptr, const char *end,
                 const char **nextTokPtr)
{
#ifdef XML_NS
  int hadColon = 0;
#endif
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#endif
    case BT_S: case BT_CR: case BT_LF:
      for (;;) {
        int t;

        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        t = BYTE_TYPE(enc, ptr);
        if (t == BT_EQUALS)
          break;
        switch (t) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
      /* fall through */
    case BT_EQUALS:
      {
        int open;
#ifdef XML_NS
        hadColon = 0;
#endif
        for (;;) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          open = BYTE_TYPE(enc, ptr);
          if (open == BT_QUOT || open == BT_APOS)
            break;
          switch (open) {
          case BT_S:
          case BT_LF:
          case BT_CR:
            break;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
        }
        ptr += MINBPC(enc);
        /* in attribute value */
        for (;;) {
          int t;
          REQUIRE_CHAR(enc, ptr, end);
          t = BYTE_TYPE(enc, ptr);
          if (t == open)
            break;
          switch (t) {
          INVALID_CASES(ptr, nextTokPtr)
          case BT_AMP:
            {
              int tok = PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, &ptr);
              if (tok <= 0) {
                if (tok == XML_TOK_INVALID)
                  *nextTokPtr = ptr;
                return tok;
              }
              break;
            }
          case BT_LT:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          default:
            ptr += MINBPC(enc);
            break;
          }
        }
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        switch (BYTE_TYPE(enc, ptr)) {
        case BT_S:
        case BT_CR:
        case BT_LF:
          break;
        case BT_SOL:
          goto sol;
        case BT_GT:
          goto gt;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
        /* ptr points to closing quote */
        for (;;) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
          case BT_S: case BT_CR: case BT_LF:
            continue;
          case BT_GT:
          gt:
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_START_TAG_WITH_ATTS;
          case BT_SOL:
          sol:
            ptr += MINBPC(enc);
            REQUIRE_CHAR(enc, ptr, end);
            if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
              *nextTokPtr = ptr;
              return XML_TOK_INVALID;
            }
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_EMPTY_ELEMENT_WITH_ATTS;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          break;
        }
        break;
      }
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}